

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::PreventExtensions
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  byte bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  BOOL BVar2;
  int iVar3;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar4;
  undefined8 extraout_RDX;
  
  bVar1 = (this->super_DynamicTypeHandler).flags;
  if ((bVar1 & 1) == 0) {
    return 1;
  }
  if ((bVar1 & 4) == 0) {
    BVar2 = PreventExtensionsInternal(this,instance);
    return BVar2;
  }
  pDVar4 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar4->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(pDVar4,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensions(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if ((this->GetFlags() & IsExtensibleFlag) == 0)
            {
                // Already not extensible => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked())
            {
                // If the type is not shared with others, we can just change it by itself.
                return PreventExtensionsInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }